

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void * Abc_ObjMvVar(Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  
  pvVar3 = Abc_NtkMvVar(pObj->pNtk);
  if (pvVar3 != (void *)0x0) {
    piVar4 = (int *)Abc_NtkMvVar(pObj->pNtk);
    pvVar3 = *(void **)(piVar4 + 2);
    if (pvVar3 == (void *)0x0) {
      __assert_fail("p->pArrayPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                    ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
    }
    iVar1 = pObj->Id;
    lVar7 = (long)iVar1;
    iVar2 = *piVar4;
    if (iVar2 <= iVar1) {
      iVar6 = iVar1 + 10;
      if (iVar1 < iVar2 * 2) {
        iVar6 = iVar2 * 2;
      }
      if (iVar2 < iVar6) {
        pvVar3 = realloc(pvVar3,(long)iVar6 * 8);
        *(void **)(piVar4 + 2) = pvVar3;
        memset((void *)((long)pvVar3 + (long)*piVar4 * 8),0,((long)iVar6 - (long)*piVar4) * 8);
        *piVar4 = iVar6;
      }
    }
    pvVar3 = *(void **)((long)pvVar3 + lVar7 * 8);
    if (pvVar3 != (void *)0x0) {
      return pvVar3;
    }
    if (*(code **)(piVar4 + 8) != (code *)0x0) {
      uVar5 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
      *(undefined8 *)(*(long *)(piVar4 + 2) + lVar7 * 8) = uVar5;
      return *(void **)(*(long *)(piVar4 + 2) + lVar7 * 8);
    }
  }
  return (void *)0x0;
}

Assistant:

static inline void *      Abc_ObjMvVar( Abc_Obj_t * pObj )              { return Abc_NtkMvVar(pObj->pNtk)? Vec_AttEntry( (Vec_Att_t *)Abc_NtkMvVar(pObj->pNtk), pObj->Id ) : NULL; }